

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcRailingType::~IfcRailingType(IfcRailingType *this)

{
  ~IfcRailingType((IfcRailingType *)&this[-1].field_0x58);
  return;
}

Assistant:

IfcRailingType() : Object("IfcRailingType") {}